

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void __thiscall
Model::get_schoenberg_grad
          (Model *this,double **g,double label,double alpha,int contextId,int centerId,
          double current_lr)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  uVar4 = (ulong)this->dim_size;
  uVar5 = -(ulong)(uVar4 == 0) | uVar4 * 8;
  puVar3 = (undefined8 *)operator_new__(uVar5);
  *puVar3 = 0;
  memset(puVar3 + 1,0,uVar5 - 8);
  dVar7 = 1.0;
  if (uVar4 != 0) {
    pdVar1 = this->emb1[contextId];
    pdVar2 = this->emb0[centerId];
    uVar5 = 0;
    do {
      puVar3[uVar5] = pdVar1[uVar5] - pdVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    dVar7 = 1.0;
    if (uVar4 != 0) {
      dVar7 = 0.0;
      uVar5 = 0;
      do {
        dVar7 = dVar7 + (double)puVar3[uVar5] * (double)puVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      dVar7 = dVar7 + 1.0;
    }
  }
  dVar6 = pow(1.0 / dVar7,alpha);
  uVar5 = (ulong)this->dim_size;
  if (uVar5 != 0) {
    dVar7 = (1.0 / dVar7) * alpha * dVar6 * ((label - dVar6) + (label - dVar6));
    pdVar1 = *g;
    uVar4 = 0;
    do {
      pdVar1[uVar4] = (double)puVar3[uVar4] * (dVar7 + dVar7);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    if (uVar5 != 0) {
      pdVar1 = *g;
      uVar4 = 0;
      do {
        pdVar1[uVar4] = pdVar1[uVar4] * -current_lr;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  operator_delete__(puVar3);
  return;
}

Assistant:

void Model::get_schoenberg_grad(double *&g, double label, double alpha, int contextId, int centerId, double current_lr) {

    double eta, e, scalar_val;
    auto *diff = new double[this->dim_size]{0};


    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d]; // (x-y)

    eta = 0.0;
    for (int d = 0; d < this->dim_size; d++)
        eta += diff[d]*diff[d];
    eta = 1.0 + eta;
    eta = 1.0 / eta; // eta = (1 + (x-y)^2 ) ^ {-1}

    e = pow(eta, alpha); // ( 1 + (x-y) )^{-\alpha}
    scalar_val = 2.0 * ( label - e  ) * ( alpha * e * eta ) * ( 2.0 );
    for (int d = 0; d < this->dim_size; d++)
        g[d] =  scalar_val * ( diff[d] );

    for (int d = 0; d < this->dim_size; d++)
        g[d] = -current_lr * g[d]; // minus comes from the objective function, minimization


    delete [] diff;
}